

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_handshake(ptls_t *tls,ptls_buffer_t *_sendbuf,void *input,size_t *inlen,
                  ptls_handshake_properties_t *properties)

{
  size_t sVar1;
  int iVar2;
  uint8_t local_d4;
  size_t local_b0;
  size_t consumed;
  ptls_buffer_t decryptbuf;
  uint8_t *src_end;
  uint8_t *src;
  size_t sendbuf_orig_off;
  undefined1 auStack_68 [4];
  int ret;
  st_ptls_record_message_emitter_t emitter;
  ptls_handshake_properties_t *properties_local;
  size_t *inlen_local;
  void *input_local;
  ptls_buffer_t *_sendbuf_local;
  ptls_t *tls_local;
  
  emitter.rec_start = (size_t)properties;
  if (PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state) {
    __assert_fail("tls->state < PTLS_STATE_POST_HANDSHAKE_MIN",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x1787,
                  "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                 );
  }
  init_record_message_emitter(tls,(st_ptls_record_message_emitter_t *)auStack_68,_sendbuf);
  sVar1 = _auStack_68->off;
  if (tls->state == PTLS_STATE_CLIENT_HANDSHAKE_START) {
    if ((input != (void *)0x0) && (*inlen != 0)) {
      __assert_fail("input == NULL || *inlen == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x178f,
                    "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                   );
    }
    tls_local._4_4_ =
         send_client_hello(tls,(ptls_message_emitter_t *)auStack_68,
                           (ptls_handshake_properties_t *)emitter.rec_start,(ptls_iovec_t *)0x0);
  }
  else if (tls->state == PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY) {
    tls_local._4_4_ =
         server_finish_handshake
                   (tls,(ptls_message_emitter_t *)auStack_68,1,(st_ptls_signature_algorithms_t *)0x0
                   );
  }
  else {
    decryptbuf._24_8_ = (long)input + *inlen;
    ptls_buffer_init((ptls_buffer_t *)&consumed,"",0);
    sendbuf_orig_off._4_4_ = 0x202;
    src_end = (uint8_t *)input;
    while (sendbuf_orig_off._4_4_ == 0x202 && src_end != (uint8_t *)decryptbuf._24_8_) {
      local_b0 = decryptbuf._24_8_ - (long)src_end;
      sendbuf_orig_off._4_4_ =
           handle_input(tls,(ptls_message_emitter_t *)auStack_68,(ptls_buffer_t *)&consumed,src_end,
                        &local_b0,(ptls_handshake_properties_t *)emitter.rec_start);
      src_end = src_end + local_b0;
      if (decryptbuf.capacity != 0) {
        __assert_fail("decryptbuf.off == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x17a3,
                      "int ptls_handshake(ptls_t *, ptls_buffer_t *, const void *, size_t *, ptls_handshake_properties_t *)"
                     );
      }
    }
    ptls_buffer_dispose((ptls_buffer_t *)&consumed);
    if ((((sendbuf_orig_off._4_4_ != 0) && (sendbuf_orig_off._4_4_ != 0x202)) &&
        (sendbuf_orig_off._4_4_ != 0x206)) && (sendbuf_orig_off._4_4_ != 0x20b)) {
      if (sendbuf_orig_off._4_4_ != 0x79) {
        (*ptls_clear_memory)(_auStack_68->base + sVar1,_auStack_68->off - sVar1);
        _auStack_68->off = sVar1;
      }
      if ((sendbuf_orig_off._4_4_ & 0xffffff00) != 0x100) {
        if ((sendbuf_orig_off._4_4_ & 0xffffff00) == 0) {
          local_d4 = (uint8_t)sendbuf_orig_off._4_4_;
        }
        else {
          local_d4 = 'P';
        }
        iVar2 = ptls_send_alert(tls,_auStack_68,'\x02',local_d4);
        if (iVar2 != 0) {
          _auStack_68->off = sVar1;
        }
      }
    }
    *inlen = *inlen - (decryptbuf._24_8_ - (long)src_end);
    tls_local._4_4_ = sendbuf_orig_off._4_4_;
  }
  return tls_local._4_4_;
}

Assistant:

int ptls_handshake(ptls_t *tls, ptls_buffer_t *_sendbuf, const void *input, size_t *inlen, ptls_handshake_properties_t *properties)
{
    struct st_ptls_record_message_emitter_t emitter;
    int ret;

    assert(tls->state < PTLS_STATE_POST_HANDSHAKE_MIN);

    init_record_message_emitter(tls, &emitter, _sendbuf);
    size_t sendbuf_orig_off = emitter.super.buf->off;

    /* special handlings */
    switch (tls->state) {
    case PTLS_STATE_CLIENT_HANDSHAKE_START: {
        assert(input == NULL || *inlen == 0);
        return send_client_hello(tls, &emitter.super, properties, NULL);
    }
    case PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY:
        return server_finish_handshake(tls, &emitter.super, 1, NULL);
    default:
        break;
    }

    const uint8_t *src = input, *const src_end = src + *inlen;
    ptls_buffer_t decryptbuf;

    ptls_buffer_init(&decryptbuf, "", 0);

    /* perform handhake until completion or until all the input has been swallowed */
    ret = PTLS_ERROR_IN_PROGRESS;
    while (ret == PTLS_ERROR_IN_PROGRESS && src != src_end) {
        size_t consumed = src_end - src;
        ret = handle_input(tls, &emitter.super, &decryptbuf, src, &consumed, properties);
        src += consumed;
        assert(decryptbuf.off == 0);
    }

    ptls_buffer_dispose(&decryptbuf);

    switch (ret) {
    case 0:
    case PTLS_ERROR_IN_PROGRESS:
    case PTLS_ERROR_STATELESS_RETRY:
    case PTLS_ERROR_ASYNC_OPERATION:
        break;
    default:
        /* Flush handshake messages that have been written partially. ECH_REQUIRED sticks out because it is a message sent
         * post-handshake compared to other alerts that are generating *during* the handshake. */
        if (ret != PTLS_ALERT_ECH_REQUIRED) {
            ptls_clear_memory(emitter.super.buf->base + sendbuf_orig_off, emitter.super.buf->off - sendbuf_orig_off);
            emitter.super.buf->off = sendbuf_orig_off;
        }
        /* send alert immediately */
        if (PTLS_ERROR_GET_CLASS(ret) != PTLS_ERROR_CLASS_PEER_ALERT)
            if (ptls_send_alert(tls, emitter.super.buf, PTLS_ALERT_LEVEL_FATAL,
                                PTLS_ERROR_GET_CLASS(ret) == PTLS_ERROR_CLASS_SELF_ALERT ? ret : PTLS_ALERT_INTERNAL_ERROR) != 0)
                emitter.super.buf->off = sendbuf_orig_off;
        break;
    }

    *inlen -= src_end - src;
    return ret;
}